

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O1

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::AddSign
          (RawTransactionResponseStruct *__return_storage_ptr__,AddSignRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  _Rb_tree_header *p_Var2;
  undefined1 local_138 [32];
  _Any_data local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  undefined1 local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var2 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._0_8_ = 0;
  local_138._8_8_ = (pointer)0x0;
  local_138._24_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:293:7)>
       ::_M_invoke;
  local_138._16_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:293:7)>
       ::_M_manager;
  local_118._M_unused._M_object = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AddSign","");
  ExecuteStructApi<cfd::js::api::AddSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)local_f8,(api *)request,
             (AddSignRequestStruct *)local_138,
             (function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&)>
              *)&local_118,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
  (__return_storage_ptr__->error).code = local_f8._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)local_b0._M_local_buf);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if ((_Base_ptr)local_90._16_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_90._8_4_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)local_90._16_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)local_90._24_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)local_90._32_8_;
    *(_Rb_tree_header **)(local_90._16_8_ + 8) = p_Var2;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_90._40_8_;
    local_90._16_8_ = (_Base_ptr)0x0;
    local_90._40_8_ = (_Base_ptr)0x0;
    local_90._24_8_ = (_Base_ptr)(local_90 + 8);
    local_90._32_8_ = (_Base_ptr)(local_90 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  if ((char *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  if ((pointer)local_d0._M_p != (pointer)&stack0xffffffffffffff40) {
    operator_delete(local_d0._M_p);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((undefined1 *)local_118._M_unused._0_8_ != local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  if ((code *)local_138._16_8_ != (code *)0x0) {
    (*(code *)local_138._16_8_)(local_138,local_138,3);
  }
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::AddSign(
    const AddSignRequestStruct& request) {
  auto call_func =
      [](const AddSignRequestStruct& request) -> RawTransactionResponseStruct {
    RawTransactionResponseStruct response;

    std::string tx_hex = request.tx;
    Txid txid(request.txin.txid);
    uint32_t vout = request.txin.vout;

    std::vector<SignParameter> sign_params;
    const auto& params = (request.txin.sign_params.empty())
                             ? request.txin.sign_param
                             : request.txin.sign_params;
    for (const SignDataStruct& sign_data : params) {
      sign_params.push_back(
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              sign_data));
    }

    bool is_witness = request.txin.is_witness;
    bool clear_stack = request.txin.clear_stack;

    TransactionApi api;
    TransactionController txc =
        api.AddSign(tx_hex, txid, vout, sign_params, is_witness, clear_stack);

    response.hex = txc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result =
      ExecuteStructApi<AddSignRequestStruct, RawTransactionResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}